

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *filename;
  
  iVar1 = SDL_Init(0x21);
  if (iVar1 < 0) {
    uVar2 = SDL_GetError();
    iVar1 = 0;
    SDL_Log("Unable to initialize SDL: %s",uVar2);
  }
  else {
    if (argc < 2) {
      filename = "res/terminus_11x11.bmp";
    }
    else {
      filename = argv[1];
    }
    iVar1 = ui_init("Snake",filename,0x32,0x19);
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      ui_effects.crt = true;
      game_run(eventpoll,draw);
      ui_quit();
      SDL_Quit();
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    if (SDL_Init(SDL_INIT_TIMER | SDL_INIT_VIDEO) < 0) {
        SDL_Log("Unable to initialize SDL: %s", SDL_GetError());
        return 0;
    }

    const char *font = argc > 1 ? argv[1] : default_font;

    if (!ui_init(title, font, UI_COLS, UI_ROWS))
        return 1;

    ui_effects.crt = true;

    game_run(eventpoll, draw);

    ui_quit();

    SDL_Quit();
    return 0;
}